

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>
          (SnapObject *snpObject,InflateMap *inflator)

{
  TypeId TVar1;
  int *piVar2;
  JavascriptLibrary *this;
  ScriptContext *pSVar3;
  DynamicObject *obj;
  JavascriptArray *pJVar4;
  RecyclableObject *pRVar5;
  uint32 length;
  
  if (snpObject->SnapObjectTag != SnapArrayObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  piVar2 = *(int **)((long)snpObject->AddtlSnapObjectInfo + 8);
  pSVar3 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  length = 0;
  if (((piVar2 != (int *)0x0) && (length = 0, *(long *)(piVar2 + 6) == 0)) && (*piVar2 == 0)) {
    length = 0;
    if ((uint)piVar2[1] < 0x101) {
      length = piVar2[1];
    }
  }
  this = (pSVar3->super_ScriptContextBase).javascriptLibrary;
  TVar1 = snpObject->SnapType->JsTypeId;
  if (TVar1 == TypeIds_ArrayLast) {
    if (length != 0) {
      pRVar5 = (RecyclableObject *)Js::JavascriptLibrary::CreateNativeFloatArray(this,length);
      return pRVar5;
    }
    pRVar5 = (RecyclableObject *)Js::JavascriptLibrary::CreateNativeFloatArray(this);
    return pRVar5;
  }
  if (TVar1 == TypeIds_NativeIntArray) {
    if (length != 0) {
      pRVar5 = (RecyclableObject *)Js::JavascriptLibrary::CreateNativeIntArray(this,length);
      return pRVar5;
    }
    pRVar5 = (RecyclableObject *)Js::JavascriptLibrary::CreateNativeIntArray(this);
    return pRVar5;
  }
  if (TVar1 == TypeIds_Array) {
    if (length == 0) {
      pJVar4 = Js::JavascriptLibrary::CreateArray(this);
      return (RecyclableObject *)pJVar4;
    }
    obj = ReuseObjectCheckAndReset(snpObject,inflator);
    if (obj != (DynamicObject *)0x0) {
      pJVar4 = Js::VarTo<Js::JavascriptArray,Js::DynamicObject>(obj);
      Js::JavascriptArray::SetLength(pJVar4,length);
      return &obj->super_RecyclableObject;
    }
    pJVar4 = Js::JavascriptLibrary::CreateArray(this,length);
    return (RecyclableObject *)pJVar4;
  }
  TTDAbort_unrecoverable_error("Unknown array type!");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapArrayInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Arrays can change type on us so seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed and add checks for same type-ness.

            const SnapArrayInfo<T>* arrayInfo = SnapObjectGetAddtlInfoAs<SnapArrayInfo<T>*, snapArrayKind>(snpObject);
            const SnapArrayInfoBlock<T>* dataBlock = arrayInfo->Data;
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptLibrary* jslib = ctx->GetLibrary();
            uint32 preAllocSpace = 0;
            if(dataBlock != nullptr && dataBlock->Next == nullptr && dataBlock->FirstIndex == 0 && dataBlock->LastIndex <= TTD_ARRAY_SMALL_ARRAY)
            {
                preAllocSpace = dataBlock->LastIndex; //first index is 0
            }

            if(snpObject->SnapType->JsTypeId == Js::TypeIds_Array)
            {
                if(preAllocSpace == 0)
                {
                    return jslib->CreateArray();
                }
                else
                {
                    Js::DynamicObject* rcObj = ReuseObjectCheckAndReset(snpObject, inflator);
                    if(rcObj != nullptr)
                    {
                        Js::VarTo<Js::JavascriptArray>(rcObj)->SetLength(preAllocSpace);
                        return rcObj;
                    }
                    else
                    {
                        return jslib->CreateArray(preAllocSpace);
                    }
                }
            }
            else if(snpObject->SnapType->JsTypeId == Js::TypeIds_NativeIntArray)
            {
                return (preAllocSpace > 0) ? ctx->GetLibrary()->CreateNativeIntArray(preAllocSpace) : ctx->GetLibrary()->CreateNativeIntArray();
            }
            else if(snpObject->SnapType->JsTypeId == Js::TypeIds_NativeFloatArray)
            {
                return (preAllocSpace > 0) ? ctx->GetLibrary()->CreateNativeFloatArray(preAllocSpace) : ctx->GetLibrary()->CreateNativeFloatArray();
            }
            else
            {
                TTDAssert(false, "Unknown array type!");
                return nullptr;
            }
        }